

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O0

void comex_igroup_finalize(comex_igroup_t *igroup)

{
  int iVar1;
  long in_RDI;
  int status;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == 0) {
    __assert_fail("igroup",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/groups.c"
                  ,0x8f,"void comex_igroup_finalize(comex_igroup_t *)");
  }
  if ((*(undefined **)(in_RDI + 0x18) != &ompi_mpi_group_null) &&
     (iVar1 = MPI_Group_free(in_RDI + 0x18), iVar1 != 0)) {
    comex_error((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  if ((*(undefined **)(in_RDI + 0x10) != &ompi_mpi_comm_null) &&
     (iVar1 = MPI_Comm_free(in_RDI + 0x10), iVar1 != 0)) {
    comex_error((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void comex_igroup_finalize(comex_igroup_t *igroup)
{
    int status;

    assert(igroup);

    if (igroup->group != MPI_GROUP_NULL) {
        status = MPI_Group_free(&igroup->group);
        if (status != MPI_SUCCESS) {
            comex_error("MPI_Group_free: Failed ", status);
        }
    }
    
    if (igroup->comm != MPI_COMM_NULL) {
        status = MPI_Comm_free(&igroup->comm);
        if (status != MPI_SUCCESS) {
            comex_error("MPI_Comm_free: Failed ", status);
        }
    }
}